

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicMax::Check(BasicMax *this,GLenum e,GLint64 value,bool max_value)

{
  bool bVar1;
  char *pcVar2;
  GLboolean local_41;
  bool status;
  double dStack_40;
  GLboolean b;
  GLdouble d;
  long lStack_30;
  GLfloat f;
  GLint64 i64;
  GLint i;
  bool max_value_local;
  GLint64 value_local;
  BasicMax *pBStack_10;
  GLenum e_local;
  BasicMax_conflict *this_local;
  
  i64._7_1_ = max_value;
  _i = value;
  value_local._4_4_ = e;
  pBStack_10 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,e,(GLint *)&i64);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,value_local._4_4_,&stack0xffffffffffffffd0);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,value_local._4_4_,(GLfloat *)((long)&d + 4));
  glu::CallLogWrapper::glGetDoublev
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,value_local._4_4_,&stack0xffffffffffffffc0);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,value_local._4_4_,&local_41);
  if ((i64._7_1_ & 1) == 0) {
    bVar1 = (long)dStack_40 <= (long)_i &&
            ((long)d._4_4_ <= (long)_i &&
            (lStack_30 <= (long)_i && (long)(int)(uint)i64 <= (long)_i));
    if ((long)dStack_40 > (long)_i ||
        ((long)d._4_4_ > (long)_i || (lStack_30 > (long)_i || (long)(int)(uint)i64 > (long)_i))) {
      pcVar2 = ShaderStorageBufferObjectBase::GLenumToString
                         ((ShaderStorageBufferObjectBase *)this,value_local._4_4_);
      anon_unknown_0::Output
                ("%s is %d should be at most %d.\n",pcVar2,(ulong)(uint)i64,_i & 0xffffffff);
    }
  }
  else {
    bVar1 = (long)_i <= (long)dStack_40 &&
            ((long)_i <= (long)d._4_4_ &&
            ((long)_i <= lStack_30 && (long)_i <= (long)(int)(uint)i64));
    if ((long)_i > (long)dStack_40 ||
        ((long)_i > (long)d._4_4_ || ((long)_i > lStack_30 || (long)_i > (long)(int)(uint)i64))) {
      pcVar2 = ShaderStorageBufferObjectBase::GLenumToString
                         ((ShaderStorageBufferObjectBase *)this,value_local._4_4_);
      anon_unknown_0::Output
                ("%s is %d should be at least %d.\n",pcVar2,(ulong)(uint)i64,_i & 0xffffffff);
    }
  }
  return bVar1;
}

Assistant:

bool Check(GLenum e, GLint64 value, bool max_value)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegerv(e, &i);
		glGetInteger64v(e, &i64);
		glGetFloatv(e, &f);
		glGetDoublev(e, &d);
		glGetBooleanv(e, &b);

		bool status = true;
		if (max_value)
		{
			if (static_cast<GLint64>(i) < value)
				status = false;
			if (i64 < value)
				status = false;
			if (static_cast<GLint64>(f) < value)
				status = false;
			if (static_cast<GLint64>(d) < value)
				status = false;

			if (!status)
			{
				Output("%s is %d should be at least %d.\n", GLenumToString(e), i, static_cast<GLint>(value));
			}
		}
		else
		{
			if (static_cast<GLint64>(i) > value)
				status = false;
			if (i64 > value)
				status = false;
			if (static_cast<GLint64>(f) > value)
				status = false;
			if (static_cast<GLint64>(d) > value)
				status = false;

			if (!status)
			{
				Output("%s is %d should be at most %d.\n", GLenumToString(e), i, static_cast<GLint>(value));
			}
		}
		return status;
	}